

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O0

void __thiscall TPZStructMatrixOT<double>::Assemble(TPZStructMatrixOT<double> *this)

{
  TPZAutoPointer<TPZGuiInterface> *in_stack_00000148;
  TPZBaseMatrix *in_stack_00000150;
  TPZBaseMatrix *in_stack_00000158;
  TPZStructMatrixOT<double> *in_stack_00000160;
  
  Assemble(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148);
  return;
}

Assistant:

void TPZStructMatrixOT<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        if(this->fNumThreads){
            this->MultiThread_Assemble(stiffness,rhsloc,guiInterface);
        }
        else{
            this->Serial_Assemble(stiffness,rhsloc,guiInterface);
        }
        
        if(ComputeRhs())equationFilter.Scatter(rhsloc, rhs);
    }
    else
    {
        if(this->fNumThreads){
            this->MultiThread_Assemble(stiffness,rhs,guiInterface);
        }
        else{
            this->Serial_Assemble(stiffness,rhs,guiInterface);
        }
    }
    ass_stiff.stop();
}